

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdflogger-c.cc
# Opt level: O0

void set_log_dest(QPDFLogger *l,function<void_(std::shared_ptr<Pipeline>)> *method,
                 qpdf_log_dest_e dest,char *identifier,qpdf_log_fn_t fn,void *udata)

{
  _func_int_char_ptr_unsigned_long_void_ptr *local_b0;
  shared_ptr<Pl_Function> local_a8;
  shared_ptr<Pipeline> local_98;
  QPDFLogger local_88;
  QPDFLogger local_78;
  QPDFLogger local_68 [2];
  shared_ptr<Pipeline> local_48;
  void *local_38;
  void *udata_local;
  qpdf_log_fn_t fn_local;
  char *identifier_local;
  function<void_(std::shared_ptr<Pipeline>)> *pfStack_18;
  qpdf_log_dest_e dest_local;
  function<void_(std::shared_ptr<Pipeline>)> *method_local;
  QPDFLogger *l_local;
  
  local_38 = udata;
  udata_local = fn;
  fn_local = (qpdf_log_fn_t)identifier;
  identifier_local._4_4_ = dest;
  pfStack_18 = method;
  method_local = (function<void_(std::shared_ptr<Pipeline>)> *)l;
  switch(dest) {
  case qpdf_log_dest_default:
    std::shared_ptr<Pipeline>::shared_ptr(&local_48,(nullptr_t)0x0);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()(method,&local_48);
    std::shared_ptr<Pipeline>::~shared_ptr(&local_48);
    break;
  case qpdf_log_dest_stdout:
    QPDFLogger::standardOutput(local_68);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()
              (method,(shared_ptr<Pipeline> *)local_68);
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)local_68);
    break;
  case qpdf_log_dest_stderr:
    QPDFLogger::standardError(&local_78);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()
              (method,(shared_ptr<Pipeline> *)&local_78);
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_78);
    break;
  case qpdf_log_dest_discard:
    QPDFLogger::discard(&local_88);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()
              (method,(shared_ptr<Pipeline> *)&local_88);
    std::shared_ptr<Pipeline>::~shared_ptr((shared_ptr<Pipeline> *)&local_88);
    break;
  case qpdf_log_dest_custom:
    local_b0 = (_func_int_char_ptr_unsigned_long_void_ptr *)0x0;
    std::
    make_shared<Pl_Function,char_const*&,decltype(nullptr),int(*&)(char_const*,unsigned_long,void*),void*&>
              ((char **)&local_a8,&fn_local,&local_b0,&udata_local);
    std::shared_ptr<Pipeline>::shared_ptr<Pl_Function,void>(&local_98,&local_a8);
    std::function<void_(std::shared_ptr<Pipeline>)>::operator()(method,&local_98);
    std::shared_ptr<Pipeline>::~shared_ptr(&local_98);
    std::shared_ptr<Pl_Function>::~shared_ptr(&local_a8);
  }
  return;
}

Assistant:

static void
set_log_dest(
    QPDFLogger* l,
    std::function<void(std::shared_ptr<Pipeline>)> method,
    qpdf_log_dest_e dest,
    char const* identifier,
    qpdf_log_fn_t fn,
    void* udata)
{
    switch (dest) {
    case qpdf_log_dest_default:
        method(nullptr);
        break;
    case qpdf_log_dest_stdout:
        method(l->standardOutput());
        break;
    case qpdf_log_dest_stderr:
        method(l->standardError());
        break;
    case qpdf_log_dest_discard:
        method(l->discard());
        break;
    case qpdf_log_dest_custom:
        method(std::make_shared<Pl_Function>(identifier, nullptr, fn, udata));
        break;
    }
}